

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateSourceForMessage
          (FileGenerator *this,int idx,Printer *printer)

{
  MessageSCCAnalyzer *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppDVar2;
  Descriptor *descriptor;
  Options *pOVar3;
  Options *printer_00;
  SCC *pSVar4;
  Options *options;
  pointer ppDVar5;
  NamespaceOpener ns;
  size_type __dnew;
  Formatter format;
  CrossFileReferences refs;
  NamespaceOpener local_1d8;
  Options *local_1b8;
  Options *local_1b0;
  string local_1a8;
  size_type local_188;
  Formatter local_180;
  CrossFileReferences local_148;
  
  local_180.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_180.vars_._M_t,&(this->variables_)._M_t);
  GenerateSourceIncludes(this,printer);
  local_148.strong_sccs._M_h._M_buckets = &local_148.strong_sccs._M_h._M_single_bucket;
  local_148.strong_sccs._M_h._M_bucket_count = 1;
  local_148.strong_sccs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_148.strong_sccs._M_h._M_element_count = 0;
  local_148.strong_sccs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_148.strong_sccs._M_h._M_rehash_policy._M_next_resize = 0;
  local_148.strong_sccs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_148.weak_sccs._M_h._M_buckets = &local_148.weak_sccs._M_h._M_single_bucket;
  local_148.weak_sccs._M_h._M_bucket_count = 1;
  local_148.weak_sccs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_148.weak_sccs._M_h._M_element_count = 0;
  local_148.weak_sccs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_148.weak_sccs._M_h._M_rehash_policy._M_next_resize = 0;
  local_148.weak_sccs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_148.weak_default_instances._M_h._M_buckets =
       &local_148.weak_default_instances._M_h._M_single_bucket;
  local_148.weak_default_instances._M_h._M_bucket_count = 1;
  local_148.weak_default_instances._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_148.weak_default_instances._M_h._M_element_count = 0;
  local_148.weak_default_instances._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_148.weak_default_instances._M_h._M_rehash_policy._M_next_resize = 0;
  local_148.weak_default_instances._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_148.strong_reflection_files._M_h._M_buckets =
       &local_148.strong_reflection_files._M_h._M_single_bucket;
  local_148.strong_reflection_files._M_h._M_bucket_count = 1;
  local_148.strong_reflection_files._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_148.strong_reflection_files._M_h._M_element_count = 0;
  local_148.strong_reflection_files._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_148.strong_reflection_files._M_h._M_rehash_policy._M_next_resize = 0;
  local_148.strong_reflection_files._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_148.weak_reflection_files._M_h._M_buckets =
       &local_148.weak_reflection_files._M_h._M_single_bucket;
  local_148.weak_reflection_files._M_h._M_bucket_count = 1;
  local_148.weak_reflection_files._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_148.weak_reflection_files._M_h._M_element_count = 0;
  local_148.weak_reflection_files._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_148.weak_reflection_files._M_h._M_rehash_policy._M_next_resize = 0;
  local_148.weak_reflection_files._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = &this->scc_analyzer_;
  options = (Options *)(long)idx;
  local_1b8 = options;
  local_1b0 = (Options *)printer;
  pSVar4 = SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::GetSCC
                     (&this_00->analyzer_,
                      *(Descriptor **)
                       (this->message_generators_).
                       super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)options]._M_t.
                       super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                       ._M_t);
  ppDVar5 = (pSVar4->descriptors).
            super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppDVar2 = (pSVar4->descriptors).
            super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppDVar5 != ppDVar2) {
    do {
      local_1d8.printer_ = (Printer *)this;
      local_1d8.name_stack_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_148;
      ForEachField<google::protobuf::compiler::cpp::FileGenerator::GenerateSourceForMessage(int,google::protobuf::io::Printer*)::__0>
                (*ppDVar5,(anon_class_16_2_3fe543fb *)&local_1d8);
      ppDVar5 = ppDVar5 + 1;
    } while (ppDVar5 != ppDVar2);
  }
  printer_00 = local_1b0;
  GenerateInternalForwardDeclarations(this,&local_148,(Printer *)local_1b0);
  pOVar3 = local_1b8;
  descriptor = *(Descriptor **)
                (this->message_generators_).
                super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)local_1b8]._M_t.
                super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                ._M_t;
  pSVar4 = SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::GetSCC
                     (&this_00->analyzer_,descriptor);
  if (*(pSVar4->descriptors).
       super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_start == descriptor) {
    pSVar4 = SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::GetSCC
                       (&this_00->analyzer_,
                        *(Descriptor **)
                         (this->message_generators_).
                         super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)pOVar3]._M_t.
                         super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                         ._M_t);
    options = printer_00;
    GenerateInitForSCC(this,pSVar4,&local_148,(Printer *)printer_00);
  }
  Namespace_abi_cxx11_(&local_1a8,(cpp *)this->file_,(FileDescriptor *)&this->options_,options);
  NamespaceOpener::NamespaceOpener(&local_1d8,&local_1a8,&local_180);
  paVar1 = &local_1a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  GenerateSourceDefaultInstance(this,idx,(Printer *)printer_00);
  Formatter::operator()<>(&local_180,"\n");
  MessageGenerator::GenerateClassMethods
            ((MessageGenerator *)
             (this->message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(long)pOVar3]._M_t.
             super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
             ._M_t,(Printer *)printer_00);
  Formatter::operator()<>(&local_180,"\n// @@protoc_insertion_point(namespace_scope)\n");
  NamespaceOpener::~NamespaceOpener(&local_1d8);
  local_188 = 0x15;
  local_1a8._M_dataplus._M_p = (pointer)paVar1;
  local_1a8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_1a8,(ulong)&local_188);
  local_1a8.field_2._M_allocated_capacity = local_188;
  builtin_strncpy(local_1a8._M_dataplus._M_p,"PROTOBUF_NAMESPACE_ID",0x15);
  local_1a8._M_string_length = local_188;
  local_1a8._M_dataplus._M_p[local_188] = '\0';
  NamespaceOpener::NamespaceOpener(&local_1d8,&local_1a8,&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  MessageGenerator::GenerateSourceInProto2Namespace
            ((MessageGenerator *)
             (this->message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(long)pOVar3]._M_t.
             super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
             ._M_t,(Printer *)printer_00);
  NamespaceOpener::~NamespaceOpener(&local_1d8);
  Formatter::operator()<>(&local_180,"\n// @@protoc_insertion_point(global_scope)\n");
  std::
  _Hashtable<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_148.weak_reflection_files._M_h);
  std::
  _Hashtable<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_148.strong_reflection_files._M_h);
  std::
  _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_148.weak_default_instances._M_h);
  std::
  _Hashtable<const_google::protobuf::compiler::SCC_*,_const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::compiler::SCC_*>,_std::hash<const_google::protobuf::compiler::SCC_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_148.weak_sccs._M_h);
  std::
  _Hashtable<const_google::protobuf::compiler::SCC_*,_const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::compiler::SCC_*>,_std::hash<const_google::protobuf::compiler::SCC_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<const_google::protobuf::compiler::SCC_*,_const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::compiler::SCC_*>,_std::hash<const_google::protobuf::compiler::SCC_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_148);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_180.vars_._M_t);
  return;
}

Assistant:

void FileGenerator::GenerateSourceForMessage(int idx, io::Printer* printer) {
  Formatter format(printer, variables_);
  GenerateSourceIncludes(printer);

  // Generate weak declarations. We do this for the whole strongly-connected
  // component (SCC), because we have a single InitDefaults* function for the
  // SCC.
  CrossFileReferences refs;
  for (const Descriptor* message :
       scc_analyzer_.GetSCC(message_generators_[idx]->descriptor_)
           ->descriptors) {
    ForEachField(message, [this, &refs](const FieldDescriptor* field) {
      GetCrossFileReferencesForField(field, &refs);
    });
  }
  GenerateInternalForwardDeclarations(refs, printer);

  if (IsSCCRepresentative(message_generators_[idx]->descriptor_)) {
    GenerateInitForSCC(GetSCC(message_generators_[idx]->descriptor_), refs,
                       printer);
  }

  {  // package namespace
    NamespaceOpener ns(Namespace(file_, options_), format);

    // Define default instances
    GenerateSourceDefaultInstance(idx, printer);

    // Generate classes.
    format("\n");
    message_generators_[idx]->GenerateClassMethods(printer);

    format(
        "\n"
        "// @@protoc_insertion_point(namespace_scope)\n");
  }  // end package namespace

  {
    NamespaceOpener proto_ns(ProtobufNamespace(options_), format);
    message_generators_[idx]->GenerateSourceInProto2Namespace(printer);
  }

  format(
      "\n"
      "// @@protoc_insertion_point(global_scope)\n");
}